

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_PLTE(LodePNGColorMode *color,uchar *data,size_t chunkLength)

{
  void *pvVar1;
  uint uVar2;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uint i;
  uint pos;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_4;
  
  local_24 = 0;
  if (*(long *)(in_RDI + 8) != 0) {
    lodepng_free((void *)0x114265);
  }
  *(ulong *)(in_RDI + 0x10) = in_RDX / 3;
  pvVar1 = lodepng_malloc(0x114292);
  *(void **)(in_RDI + 8) = pvVar1;
  if ((*(long *)(in_RDI + 8) == 0) && (*(long *)(in_RDI + 0x10) != 0)) {
    *(undefined8 *)(in_RDI + 0x10) = 0;
    local_4 = 0x53;
  }
  else if (*(ulong *)(in_RDI + 0x10) < 0x101) {
    for (local_28 = 0; (ulong)local_28 != *(ulong *)(in_RDI + 0x10); local_28 = local_28 + 1) {
      *(undefined1 *)(*(long *)(in_RDI + 8) + (ulong)(local_28 << 2)) =
           *(undefined1 *)(in_RSI + (ulong)local_24);
      uVar2 = local_24 + 2;
      *(undefined1 *)(*(long *)(in_RDI + 8) + (ulong)(local_28 * 4 + 1)) =
           *(undefined1 *)(in_RSI + (ulong)(local_24 + 1));
      local_24 = local_24 + 3;
      *(undefined1 *)(*(long *)(in_RDI + 8) + (ulong)(local_28 * 4 + 2)) =
           *(undefined1 *)(in_RSI + (ulong)uVar2);
      *(undefined1 *)(*(long *)(in_RDI + 8) + (ulong)(local_28 * 4 + 3)) = 0xff;
    }
    local_4 = 0;
  }
  else {
    local_4 = 0x26;
  }
  return local_4;
}

Assistant:

static unsigned readChunk_PLTE(LodePNGColorMode* color, const unsigned char* data, size_t chunkLength)
{
  unsigned pos = 0, i;
  if(color->palette) lodepng_free(color->palette);
  color->palettesize = chunkLength / 3;
  color->palette = (unsigned char*)lodepng_malloc(4 * color->palettesize);
  if(!color->palette && color->palettesize)
  {
    color->palettesize = 0;
    return 83; /*alloc fail*/
  }
  if(color->palettesize > 256) return 38; /*error: palette too big*/

  for(i = 0; i != color->palettesize; ++i)
  {
    color->palette[4 * i + 0] = data[pos++]; /*R*/
    color->palette[4 * i + 1] = data[pos++]; /*G*/
    color->palette[4 * i + 2] = data[pos++]; /*B*/
    color->palette[4 * i + 3] = 255; /*alpha*/
  }

  return 0; /* OK */
}